

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

void session_inbound_frame_reset(nghttp2_session *session)

{
  nghttp2_inbound_frame *frame;
  nghttp2_mem *mem;
  uint8_t **ppuVar1;
  nghttp2_buf *buf;
  byte bVar2;
  
  frame = &session->iframe;
  mem = &session->mem;
  bVar2 = (session->iframe).frame.hd.type;
  switch(bVar2) {
  case 0:
    break;
  case 1:
    nghttp2_frame_headers_free((nghttp2_headers *)frame,mem);
    break;
  case 2:
    nghttp2_frame_priority_free((nghttp2_priority *)frame);
    break;
  case 3:
    nghttp2_frame_rst_stream_free((nghttp2_rst_stream *)frame);
    break;
  case 4:
    nghttp2_frame_settings_free((nghttp2_settings *)frame,mem);
    nghttp2_mem_free(mem,(session->iframe).iv);
    (session->iframe).iv = (nghttp2_settings_entry *)0x0;
    (session->iframe).niv = 0;
    (session->iframe).max_niv = 0;
    break;
  case 5:
    nghttp2_frame_push_promise_free((nghttp2_push_promise *)frame,mem);
    break;
  case 6:
    nghttp2_frame_ping_free((nghttp2_ping *)frame);
    break;
  case 7:
    nghttp2_frame_goaway_free((nghttp2_goaway *)frame,mem);
    break;
  case 8:
    nghttp2_frame_window_update_free((nghttp2_window_update *)frame);
    break;
  default:
    if ((session->user_recv_ext_types[bVar2 >> 3] >> (bVar2 & 7) & 1) == 0) {
      if (bVar2 == 0xc) {
        if ((session->builtin_recv_ext_types & 2) != 0) {
          nghttp2_frame_origin_free((nghttp2_extension *)frame,mem);
        }
      }
      else if ((bVar2 == 10) && ((session->builtin_recv_ext_types & 1) != 0)) {
        nghttp2_frame_altsvc_free((nghttp2_extension *)frame,mem);
      }
    }
    else {
      nghttp2_frame_extension_free((nghttp2_extension *)frame);
    }
  }
  (session->iframe).ext_frame_payload.altsvc.field_value = (uint8_t *)0x0;
  (session->iframe).ext_frame_payload.altsvc.field_value_len = 0;
  (session->iframe).ext_frame_payload.altsvc.origin = (uint8_t *)0x0;
  (session->iframe).ext_frame_payload.altsvc.origin_len = 0;
  (session->iframe).frame.headers.nvlen = 0;
  *(undefined8 *)((long)&(session->iframe).frame + 0x38) = 0;
  (session->iframe).frame.push_promise.nvlen = 0;
  (session->iframe).frame.headers.nva = (nghttp2_nv *)0x0;
  (session->iframe).frame.data.padlen = 0;
  (session->iframe).frame.settings.iv = (nghttp2_settings_entry *)0x0;
  (frame->frame).hd.length = 0;
  *(int32_t *)((long)&(session->iframe).frame + 8) = 0;
  *(uint8_t *)((long)&(session->iframe).frame + 0xc) = '\0';
  *(uint8_t *)((long)&(session->iframe).frame + 0xd) = '\0';
  *(uint8_t *)((long)&(session->iframe).frame + 0xe) = '\0';
  *(undefined1 *)((long)&(session->iframe).frame + 0xf) = 0;
  (session->iframe).state = NGHTTP2_IB_READ_HEAD;
  nghttp2_buf_wrap_init(&(session->iframe).sbuf,(session->iframe).raw_sbuf,0x20);
  ppuVar1 = &(session->iframe).sbuf.mark;
  *ppuVar1 = *ppuVar1 + 9;
  buf = &(session->iframe).lbuf;
  nghttp2_buf_free(buf,mem);
  nghttp2_buf_wrap_init(buf,(uint8_t *)0x0,0);
  (session->iframe).raw_lbuf = (uint8_t *)0x0;
  (session->iframe).payloadleft = 0;
  (session->iframe).padlen = 0;
  return;
}

Assistant:

static void session_inbound_frame_reset(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_mem *mem = &session->mem;
  /* A bit risky code, since if this function is called from
     nghttp2_session_new(), we rely on the fact that
     iframe->frame.hd.type is 0, so that no free is performed. */
  switch (iframe->frame.hd.type) {
  case NGHTTP2_DATA:
    break;
  case NGHTTP2_HEADERS:
    nghttp2_frame_headers_free(&iframe->frame.headers, mem);
    break;
  case NGHTTP2_PRIORITY:
    nghttp2_frame_priority_free(&iframe->frame.priority);
    break;
  case NGHTTP2_RST_STREAM:
    nghttp2_frame_rst_stream_free(&iframe->frame.rst_stream);
    break;
  case NGHTTP2_SETTINGS:
    nghttp2_frame_settings_free(&iframe->frame.settings, mem);

    nghttp2_mem_free(mem, iframe->iv);

    iframe->iv = NULL;
    iframe->niv = 0;
    iframe->max_niv = 0;

    break;
  case NGHTTP2_PUSH_PROMISE:
    nghttp2_frame_push_promise_free(&iframe->frame.push_promise, mem);
    break;
  case NGHTTP2_PING:
    nghttp2_frame_ping_free(&iframe->frame.ping);
    break;
  case NGHTTP2_GOAWAY:
    nghttp2_frame_goaway_free(&iframe->frame.goaway, mem);
    break;
  case NGHTTP2_WINDOW_UPDATE:
    nghttp2_frame_window_update_free(&iframe->frame.window_update);
    break;
  default:
    /* extension frame */
    if (check_ext_type_set(session->user_recv_ext_types,
                           iframe->frame.hd.type)) {
      nghttp2_frame_extension_free(&iframe->frame.ext);
    } else {
      switch (iframe->frame.hd.type) {
      case NGHTTP2_ALTSVC:
        if ((session->builtin_recv_ext_types & NGHTTP2_TYPEMASK_ALTSVC) == 0) {
          break;
        }
        nghttp2_frame_altsvc_free(&iframe->frame.ext, mem);
        break;
      case NGHTTP2_ORIGIN:
        if ((session->builtin_recv_ext_types & NGHTTP2_TYPEMASK_ORIGIN) == 0) {
          break;
        }
        nghttp2_frame_origin_free(&iframe->frame.ext, mem);
        break;
      case NGHTTP2_PRIORITY_UPDATE:
        if ((session->builtin_recv_ext_types &
             NGHTTP2_TYPEMASK_PRIORITY_UPDATE) == 0) {
          break;
        }
        /* Do not call nghttp2_frame_priority_update_free, because all
           fields point to sbuf. */
        break;
      }
    }

    break;
  }

  memset(&iframe->frame, 0, sizeof(nghttp2_frame));
  memset(&iframe->ext_frame_payload, 0, sizeof(nghttp2_ext_frame_payload));

  iframe->state = NGHTTP2_IB_READ_HEAD;

  nghttp2_buf_wrap_init(&iframe->sbuf, iframe->raw_sbuf,
                        sizeof(iframe->raw_sbuf));
  iframe->sbuf.mark += NGHTTP2_FRAME_HDLEN;

  nghttp2_buf_free(&iframe->lbuf, mem);
  nghttp2_buf_wrap_init(&iframe->lbuf, NULL, 0);

  iframe->raw_lbuf = NULL;

  iframe->payloadleft = 0;
  iframe->padlen = 0;
}